

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_union_table
               (flatcc_json_printer_t *ctx,flatcc_json_printer_union_descriptor_t *ud,
               flatcc_json_printer_table_f *pf)

{
  void *p;
  flatcc_json_printer_table_f *pf_local;
  flatcc_json_printer_union_descriptor_t *ud_local;
  flatcc_json_printer_t *ctx_local;
  
  p = read_uoffset_ptr(ud->member);
  print_table_object(ctx,p,ud->ttl,pf);
  return;
}

Assistant:

void flatcc_json_printer_union_table(flatcc_json_printer_t *ctx,
        flatcc_json_printer_union_descriptor_t *ud,
        flatcc_json_printer_table_f pf)
{
    print_table_object(ctx, read_uoffset_ptr(ud->member), ud->ttl, pf);
}